

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex.cc
# Opt level: O3

ostream * operator<<(ostream *os,Complex *rhs)

{
  undefined1 auVar1 [16];
  double dVar2;
  ostream *poVar3;
  undefined4 unaff_EBP;
  uint uVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  
  fVar6 = (*rhs).real;
  fVar7 = (*rhs).imag;
  lVar5 = -(ulong)(ABS(fVar7) < 1e-10);
  auVar1._8_4_ = (int)lVar5;
  auVar1._0_8_ = -(ulong)(ABS(fVar6) < 1e-10);
  auVar1._12_4_ = (int)((ulong)lVar5 >> 0x20);
  uVar4 = movmskpd(unaff_EBP,auVar1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  dVar2 = 0.0;
  if ((uVar4 & 1) == 0) {
    dVar2 = (double)fVar6;
  }
  poVar3 = std::ostream::_M_insert<double>(dVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
  dVar2 = 0.0;
  if ((uVar4 & 2) == 0) {
    dVar2 = (double)fVar7;
  }
  poVar3 = std::ostream::_M_insert<double>(dVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  return os;
}

Assistant:

Complex::Complex(const Complex & rhs) : real(rhs.real), imag(rhs.imag) {}